

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseConstVector(JSONParser *this,ValueTypes *out_types,Values *out_values)

{
  pointer pVVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  bool bVar5;
  TypedValue tv;
  
  pVVar1 = (out_values->
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  RVar3 = Expect(this,"[");
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    bVar5 = true;
    while (bVar2 = Match(this,"]"), !bVar2) {
      if ((!bVar5) && (RVar3 = Expect(this,","), RVar3.enum_ == Error)) {
        return (Result)Error;
      }
      tv.value.field_0.i64_ = 0;
      tv.value.field_0._8_8_ = 0;
      RVar3 = ParseConst(this,&tv);
      if (RVar3.enum_ == Error) {
        return (Result)Error;
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_types,&tv.type);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
                (out_values,&tv.value);
      bVar5 = false;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseConstVector(ValueTypes* out_types,
                                          Values* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    TypedValue tv;
    CHECK_RESULT(ParseConst(&tv));
    out_types->push_back(tv.type);
    out_values->push_back(tv.value);
    first = false;
  }
  return wabt::Result::Ok;
}